

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<signed_char,signed_char>
          (Thread *this,BinopFunc<signed_char,_signed_char> *f)

{
  char cVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Value local_48;
  Value local_38;
  
  VVar3 = Pop(this);
  local_38 = Pop(this);
  lVar2 = 0;
  do {
    cVar1 = (*f)(*(char *)((long)&local_38 + lVar2),VVar3._0_1_);
    *(char *)((long)&local_48 + lVar2) = cVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}